

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O1

int onigenc_minimum_property_name_to_ctype(OnigEncoding enc,OnigUChar *p,OnigUChar *end)

{
  short sVar1;
  int iVar2;
  OnigCodePoint OVar3;
  int iVar4;
  PosixBracketEntryType *pPVar5;
  int iVar6;
  OnigUChar *pOVar7;
  char *pcVar8;
  
  iVar6 = 0;
  if (p < end) {
    iVar6 = 0;
    pOVar7 = p;
    do {
      iVar2 = (*enc->mbc_enc_len)(pOVar7);
      pOVar7 = pOVar7 + iVar2;
      iVar6 = iVar6 + 1;
    } while (pOVar7 < end);
  }
  pPVar5 = onigenc_minimum_property_name_to_ctype::PBS;
  pcVar8 = "Alnum";
  do {
    sVar1 = pPVar5->len;
    if (iVar6 == sVar1) {
      if (sVar1 < 1) {
LAB_0012c88c:
        return pPVar5->ctype;
      }
      iVar2 = sVar1 + 1;
      pOVar7 = p;
      while (pOVar7 < end) {
        OVar3 = (*enc->mbc_to_code)(pOVar7,end);
        if (OVar3 != (byte)*pcVar8) goto LAB_0012c873;
        pcVar8 = (char *)((byte *)pcVar8 + 1);
        iVar4 = (*enc->mbc_enc_len)(pOVar7);
        pOVar7 = pOVar7 + iVar4;
        iVar2 = iVar2 + -1;
        if (iVar2 < 2) goto LAB_0012c88c;
      }
      if (*pcVar8 == 0) goto LAB_0012c88c;
    }
LAB_0012c873:
    pcVar8 = (char *)pPVar5[1].name;
    pPVar5 = pPVar5 + 1;
    if ((byte *)pcVar8 == (byte *)0x0) {
      return -0xdf;
    }
  } while( true );
}

Assistant:

extern int
onigenc_minimum_property_name_to_ctype(OnigEncoding enc, UChar* p, UChar* end)
{
  static PosixBracketEntryType PBS[] = {
    { (UChar* )"Alnum",  ONIGENC_CTYPE_ALNUM,  5 },
    { (UChar* )"Alpha",  ONIGENC_CTYPE_ALPHA,  5 },
    { (UChar* )"Blank",  ONIGENC_CTYPE_BLANK,  5 },
    { (UChar* )"Cntrl",  ONIGENC_CTYPE_CNTRL,  5 },
    { (UChar* )"Digit",  ONIGENC_CTYPE_DIGIT,  5 },
    { (UChar* )"Graph",  ONIGENC_CTYPE_GRAPH,  5 },
    { (UChar* )"Lower",  ONIGENC_CTYPE_LOWER,  5 },
    { (UChar* )"Print",  ONIGENC_CTYPE_PRINT,  5 },
    { (UChar* )"Punct",  ONIGENC_CTYPE_PUNCT,  5 },
    { (UChar* )"Space",  ONIGENC_CTYPE_SPACE,  5 },
    { (UChar* )"Upper",  ONIGENC_CTYPE_UPPER,  5 },
    { (UChar* )"XDigit", ONIGENC_CTYPE_XDIGIT, 6 },
    { (UChar* )"ASCII",  ONIGENC_CTYPE_ASCII,  5 },
    { (UChar* )"Word",   ONIGENC_CTYPE_WORD,   4 },
    { (UChar* )NULL, -1, 0 }
  };

  PosixBracketEntryType *pb;
  int len;

  len = onigenc_strlen(enc, p, end);
  for (pb = PBS; IS_NOT_NULL(pb->name); pb++) {
    if (len == pb->len &&
        onigenc_with_ascii_strncmp(enc, p, end, pb->name, pb->len) == 0)
      return pb->ctype;
  }

  return ONIGERR_INVALID_CHAR_PROPERTY_NAME;
}